

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O1

void Catch::handleExceptionMatchExpr(AssertionHandler *handler,string *str,StringRef *matcherString)

{
  StringMatcher local_90;
  undefined1 *local_58;
  undefined1 local_48 [16];
  undefined1 *local_38;
  undefined1 local_28 [16];
  
  Matchers::Equals((EqualsMatcher *)&local_90,str,Yes);
  handleExceptionMatchExpr(handler,&local_90,matcherString);
  local_90.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__StringMatcherBase_0019eaa0;
  local_90.
  super_MatcherMethod<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._vptr_MatcherMethod = (_func_int **)&DAT_0019eac8;
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  local_90.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)&PTR__MatcherUntypedBase_0019e9a0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p !=
      &local_90.super_MatcherUntypedBase.m_cachedToString.field_2) {
    operator_delete(local_90.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p);
  }
  return;
}

Assistant:

void handleExceptionMatchExpr( AssertionHandler& handler, std::string const& str, StringRef const& matcherString  ) {
        handleExceptionMatchExpr( handler, Matchers::Equals( str ), matcherString );
    }